

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qhttpthreaddelegate_p.cpp
# Opt level: O1

void QHttpThreadDelegate::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  bool _t4;
  long *plVar1;
  QHttpHeaders *_t1;
  QSharedPointer<char> _t5;
  offset_in_QHttpThreadDelegate_to_subr *candidate;
  undefined8 *puVar2;
  undefined4 uVar3;
  QString *pQVar4;
  InterfaceType *pIVar5;
  int iVar6;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  bool in_stack_ffffffffffffff88;
  undefined8 local_70;
  Data *local_68;
  undefined8 local_60;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (_c == RegisterMethodArgumentMetaType) {
    switch(_id) {
    case 0:
    case 0x1d:
    case 0x21:
      puVar2 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
        pIVar5 = &QtPrivate::QMetaTypeInterfaceWrapper<QHttpNetworkRequest>::metaType;
LAB_0021542a:
        *puVar2 = pIVar5;
        goto LAB_002155b8;
      }
      break;
    case 1:
    case 0x22:
      puVar2 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
        pIVar5 = &QtPrivate::QMetaTypeInterfaceWrapper<QNetworkProxy>::metaType;
        goto LAB_0021542a;
      }
      break;
    default:
      puVar2 = (undefined8 *)*_a;
      break;
    case 3:
    case 0x1f:
      puVar2 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
        pIVar5 = &QtPrivate::QMetaTypeInterfaceWrapper<QList<QSslError>_>::metaType;
        goto LAB_0021542a;
      }
      break;
    case 4:
      puVar2 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
        pIVar5 = &QtPrivate::QMetaTypeInterfaceWrapper<QSslConfiguration>::metaType;
        goto LAB_0021542a;
      }
      break;
    case 5:
    case 0x20:
      puVar2 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
        pIVar5 = &QtPrivate::QMetaTypeInterfaceWrapper<QSslPreSharedKeyAuthenticator_*>::metaType;
        goto LAB_0021542a;
      }
      break;
    case 0xb:
    case 0x15:
    case 0x16:
    case 0x18:
    case 0x19:
      puVar2 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
        pIVar5 = &QtPrivate::QMetaTypeInterfaceWrapper<QNetworkReply::NetworkError>::metaType;
        goto LAB_0021542a;
      }
    }
    *puVar2 = 0;
    goto LAB_002155b8;
  }
  if (_c == IndexOfMethod) {
    plVar1 = (long *)_a[1];
    if (((((((code *)*plVar1 == authenticationRequired) && (uVar3 = 0, plVar1[1] == 0)) ||
          (((code *)*plVar1 == proxyAuthenticationRequired && (uVar3 = 1, plVar1[1] == 0)))) ||
         ((((code *)*plVar1 == encrypted && (uVar3 = 2, plVar1[1] == 0)) ||
          (((code *)*plVar1 == sslErrors && (uVar3 = 3, plVar1[1] == 0)))))) ||
        (((((((code *)*plVar1 == sslConfigurationChanged && (uVar3 = 4, plVar1[1] == 0)) ||
            (((code *)*plVar1 == preSharedKeyAuthenticationRequired && (uVar3 = 5, plVar1[1] == 0)))
            ) || (((code *)*plVar1 == socketStartedConnecting && (uVar3 = 6, plVar1[1] == 0)))) ||
          (((code *)*plVar1 == requestSent && (uVar3 = 7, plVar1[1] == 0)))) ||
         ((((code *)*plVar1 == downloadMetaData && (uVar3 = 8, plVar1[1] == 0)) ||
          (((code *)*plVar1 == downloadProgress && (uVar3 = 9, plVar1[1] == 0)))))))) ||
       ((((code *)*plVar1 == downloadData && (uVar3 = 10, plVar1[1] == 0)) ||
        ((((code *)*plVar1 == error && (uVar3 = 0xb, plVar1[1] == 0)) ||
         ((((code *)*plVar1 == downloadFinished && (uVar3 = 0xc, plVar1[1] == 0)) ||
          (((code *)*plVar1 == redirected && (uVar3 = 0xd, plVar1[1] == 0)))))))))) {
      *(undefined4 *)*_a = uVar3;
    }
    goto LAB_002155b8;
  }
  if (_c != InvokeMetaMethod) goto LAB_002155b8;
  switch(_id) {
  case 0:
    local_58.d.ptr = (char16_t *)_a[1];
    local_60 = *_a[2];
    local_58.d.size = (qsizetype)&local_60;
    pQVar4 = &local_58;
    local_58.d.d = (Data *)0x0;
    iVar6 = 0;
    goto LAB_00215379;
  case 1:
    local_58.d.ptr = (char16_t *)_a[1];
    local_60 = *_a[2];
    local_58.d.size = (qsizetype)&local_60;
    pQVar4 = &local_58;
    local_58.d.d = (Data *)0x0;
    iVar6 = 1;
    goto LAB_00215379;
  case 2:
    iVar6 = 2;
    goto LAB_00215377;
  case 3:
    sslErrors((QHttpThreadDelegate *)_o,(QList<QSslError> *)_a[1],*_a[2],*_a[3]);
    break;
  case 4:
    local_58.d.ptr = (char16_t *)_a[1];
    pQVar4 = &local_58;
    local_58.d.d = (Data *)0x0;
    iVar6 = 4;
    goto LAB_00215379;
  case 5:
    local_60 = *_a[1];
    local_58.d.ptr = (char16_t *)&local_60;
    pQVar4 = &local_58;
    local_58.d.d = (Data *)0x0;
    iVar6 = 5;
    goto LAB_00215379;
  case 6:
    iVar6 = 6;
    goto LAB_00215377;
  case 7:
    iVar6 = 7;
    goto LAB_00215377;
  case 8:
    _t1 = (QHttpHeaders *)_a[1];
    iVar6 = *_a[2];
    pQVar4 = (QString *)_a[3];
    _t4 = *_a[4];
    local_70 = *_a[5];
    local_68 = *(Data **)((long)_a[5] + 8);
    if (local_68 != (Data *)0x0) {
      LOCK();
      (local_68->weakref)._q_value.super___atomic_base<int>._M_i =
           (local_68->weakref)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      LOCK();
      (local_68->strongref)._q_value.super___atomic_base<int>._M_i =
           (local_68->strongref)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    _t5.d = *_a[7];
    _t5.value.ptr = *_a[6];
    downloadMetaData((QHttpThreadDelegate *)_o,_t1,iVar6,pQVar4,_t4,_t5,(qint64)&local_70,
                     (ulong)*_a[8],*_a[9],in_stack_ffffffffffffff88);
    QSharedPointer<char>::deref(local_68);
    break;
  case 9:
    downloadProgress((QHttpThreadDelegate *)_o,*_a[1],*_a[2]);
    break;
  case 10:
    local_58.d.ptr = (char16_t *)_a[1];
    pQVar4 = &local_58;
    local_58.d.d = (Data *)0x0;
    iVar6 = 10;
    goto LAB_00215379;
  case 0xb:
    local_58.d.size = (qsizetype)_a[2];
    local_58.d.ptr = (char16_t *)&local_60;
    local_60 = CONCAT44(local_60._4_4_,*_a[1]);
    pQVar4 = &local_58;
    local_58.d.d = (Data *)0x0;
    iVar6 = 0xb;
    goto LAB_00215379;
  case 0xc:
    iVar6 = 0xc;
LAB_00215377:
    pQVar4 = (QString *)0x0;
LAB_00215379:
    QMetaObject::activate(_o,&staticMetaObject,iVar6,(void **)pQVar4);
    break;
  case 0xd:
    redirected((QHttpThreadDelegate *)_o,(QUrl *)_a[1],*_a[2],*_a[3]);
    break;
  case 0xe:
    startRequest((QHttpThreadDelegate *)_o);
    break;
  case 0xf:
    abortRequest((QHttpThreadDelegate *)_o);
    break;
  case 0x10:
    readBufferSizeChanged((QHttpThreadDelegate *)_o,*_a[1]);
    break;
  case 0x11:
    readBufferFreed((QHttpThreadDelegate *)_o,*_a[1]);
    break;
  case 0x12:
    startRequestSynchronously((QHttpThreadDelegate *)_o);
    break;
  case 0x13:
    readyReadSlot((QHttpThreadDelegate *)_o);
    break;
  case 0x14:
    finishedSlot((QHttpThreadDelegate *)_o);
    break;
  case 0x15:
    finishedWithErrorSlot((QHttpThreadDelegate *)_o,*_a[1],(QString *)_a[2]);
    break;
  case 0x16:
    local_58.d.d = (Data *)0x0;
    local_58.d.ptr = (char16_t *)0x0;
    local_58.d.size = 0;
    finishedWithErrorSlot((QHttpThreadDelegate *)_o,*_a[1],&local_58);
    goto LAB_002156d2;
  case 0x17:
    synchronousFinishedSlot((QHttpThreadDelegate *)_o);
    break;
  case 0x18:
    synchronousFinishedWithErrorSlot((QHttpThreadDelegate *)_o,*_a[1],(QString *)_a[2]);
    break;
  case 0x19:
    local_58.d.d = (Data *)0x0;
    local_58.d.ptr = (char16_t *)0x0;
    local_58.d.size = 0;
    synchronousFinishedWithErrorSlot((QHttpThreadDelegate *)_o,*_a[1],&local_58);
LAB_002156d2:
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
      }
    }
    break;
  case 0x1a:
    headerChangedSlot((QHttpThreadDelegate *)_o);
    break;
  case 0x1b:
    synchronousHeaderChangedSlot((QHttpThreadDelegate *)_o);
    break;
  case 0x1c:
    dataReadProgressSlot((QHttpThreadDelegate *)_o,*_a[1],*_a[2]);
    break;
  case 0x1d:
    cacheCredentialsSlot((QHttpThreadDelegate *)_o,(QHttpNetworkRequest *)_a[1],*_a[2]);
    break;
  case 0x1e:
    encryptedSlot((QHttpThreadDelegate *)_o);
    break;
  case 0x1f:
    sslErrorsSlot((QHttpThreadDelegate *)_o,(QList<QSslError> *)_a[1]);
    break;
  case 0x20:
    preSharedKeyAuthenticationRequiredSlot((QHttpThreadDelegate *)_o,*_a[1]);
    break;
  case 0x21:
    synchronousAuthenticationRequiredSlot
              ((QHttpThreadDelegate *)_o,(QHttpNetworkRequest *)CONCAT44(in_register_00000034,_c),
               *_a[2]);
    break;
  case 0x22:
    synchronousProxyAuthenticationRequiredSlot
              ((QHttpThreadDelegate *)_o,(QNetworkProxy *)_a[1],*_a[2]);
  }
LAB_002155b8:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHttpThreadDelegate::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QHttpThreadDelegate *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->authenticationRequired((*reinterpret_cast< std::add_pointer_t<QHttpNetworkRequest>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QAuthenticator*>>(_a[2]))); break;
        case 1: _t->proxyAuthenticationRequired((*reinterpret_cast< std::add_pointer_t<QNetworkProxy>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QAuthenticator*>>(_a[2]))); break;
        case 2: _t->encrypted(); break;
        case 3: _t->sslErrors((*reinterpret_cast< std::add_pointer_t<QList<QSslError>>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<bool*>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QList<QSslError>*>>(_a[3]))); break;
        case 4: _t->sslConfigurationChanged((*reinterpret_cast< std::add_pointer_t<QSslConfiguration>>(_a[1]))); break;
        case 5: _t->preSharedKeyAuthenticationRequired((*reinterpret_cast< std::add_pointer_t<QSslPreSharedKeyAuthenticator*>>(_a[1]))); break;
        case 6: _t->socketStartedConnecting(); break;
        case 7: _t->requestSent(); break;
        case 8: _t->downloadMetaData((*reinterpret_cast< std::add_pointer_t<QHttpHeaders>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[3])),(*reinterpret_cast< std::add_pointer_t<bool>>(_a[4])),(*reinterpret_cast< std::add_pointer_t<QSharedPointer<char>>>(_a[5])),(*reinterpret_cast< std::add_pointer_t<qint64>>(_a[6])),(*reinterpret_cast< std::add_pointer_t<qint64>>(_a[7])),(*reinterpret_cast< std::add_pointer_t<bool>>(_a[8])),(*reinterpret_cast< std::add_pointer_t<bool>>(_a[9]))); break;
        case 9: _t->downloadProgress((*reinterpret_cast< std::add_pointer_t<qint64>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<qint64>>(_a[2]))); break;
        case 10: _t->downloadData((*reinterpret_cast< std::add_pointer_t<QByteArray>>(_a[1]))); break;
        case 11: _t->error((*reinterpret_cast< std::add_pointer_t<QNetworkReply::NetworkError>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[2]))); break;
        case 12: _t->downloadFinished(); break;
        case 13: _t->redirected((*reinterpret_cast< std::add_pointer_t<QUrl>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3]))); break;
        case 14: _t->startRequest(); break;
        case 15: _t->abortRequest(); break;
        case 16: _t->readBufferSizeChanged((*reinterpret_cast< std::add_pointer_t<qint64>>(_a[1]))); break;
        case 17: _t->readBufferFreed((*reinterpret_cast< std::add_pointer_t<qint64>>(_a[1]))); break;
        case 18: _t->startRequestSynchronously(); break;
        case 19: _t->readyReadSlot(); break;
        case 20: _t->finishedSlot(); break;
        case 21: _t->finishedWithErrorSlot((*reinterpret_cast< std::add_pointer_t<QNetworkReply::NetworkError>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[2]))); break;
        case 22: _t->finishedWithErrorSlot((*reinterpret_cast< std::add_pointer_t<QNetworkReply::NetworkError>>(_a[1]))); break;
        case 23: _t->synchronousFinishedSlot(); break;
        case 24: _t->synchronousFinishedWithErrorSlot((*reinterpret_cast< std::add_pointer_t<QNetworkReply::NetworkError>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[2]))); break;
        case 25: _t->synchronousFinishedWithErrorSlot((*reinterpret_cast< std::add_pointer_t<QNetworkReply::NetworkError>>(_a[1]))); break;
        case 26: _t->headerChangedSlot(); break;
        case 27: _t->synchronousHeaderChangedSlot(); break;
        case 28: _t->dataReadProgressSlot((*reinterpret_cast< std::add_pointer_t<qint64>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<qint64>>(_a[2]))); break;
        case 29: _t->cacheCredentialsSlot((*reinterpret_cast< std::add_pointer_t<QHttpNetworkRequest>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QAuthenticator*>>(_a[2]))); break;
        case 30: _t->encryptedSlot(); break;
        case 31: _t->sslErrorsSlot((*reinterpret_cast< std::add_pointer_t<QList<QSslError>>>(_a[1]))); break;
        case 32: _t->preSharedKeyAuthenticationRequiredSlot((*reinterpret_cast< std::add_pointer_t<QSslPreSharedKeyAuthenticator*>>(_a[1]))); break;
        case 33: _t->synchronousAuthenticationRequiredSlot((*reinterpret_cast< std::add_pointer_t<QHttpNetworkRequest>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QAuthenticator*>>(_a[2]))); break;
        case 34: _t->synchronousProxyAuthenticationRequiredSlot((*reinterpret_cast< std::add_pointer_t<QNetworkProxy>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QAuthenticator*>>(_a[2]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 0:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QHttpNetworkRequest >(); break;
            }
            break;
        case 1:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QNetworkProxy >(); break;
            }
            break;
        case 3:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QList<QSslError> >(); break;
            }
            break;
        case 4:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QSslConfiguration >(); break;
            }
            break;
        case 5:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QSslPreSharedKeyAuthenticator* >(); break;
            }
            break;
        case 11:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QNetworkReply::NetworkError >(); break;
            }
            break;
        case 21:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QNetworkReply::NetworkError >(); break;
            }
            break;
        case 22:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QNetworkReply::NetworkError >(); break;
            }
            break;
        case 24:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QNetworkReply::NetworkError >(); break;
            }
            break;
        case 25:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QNetworkReply::NetworkError >(); break;
            }
            break;
        case 29:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QHttpNetworkRequest >(); break;
            }
            break;
        case 31:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QList<QSslError> >(); break;
            }
            break;
        case 32:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QSslPreSharedKeyAuthenticator* >(); break;
            }
            break;
        case 33:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QHttpNetworkRequest >(); break;
            }
            break;
        case 34:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QNetworkProxy >(); break;
            }
            break;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QHttpThreadDelegate::*)(const QHttpNetworkRequest & , QAuthenticator * )>(_a, &QHttpThreadDelegate::authenticationRequired, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QHttpThreadDelegate::*)(const QNetworkProxy & , QAuthenticator * )>(_a, &QHttpThreadDelegate::proxyAuthenticationRequired, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QHttpThreadDelegate::*)()>(_a, &QHttpThreadDelegate::encrypted, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QHttpThreadDelegate::*)(const QList<QSslError> & , bool * , QList<QSslError> * )>(_a, &QHttpThreadDelegate::sslErrors, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QHttpThreadDelegate::*)(const QSslConfiguration & )>(_a, &QHttpThreadDelegate::sslConfigurationChanged, 4))
            return;
        if (QtMocHelpers::indexOfMethod<void (QHttpThreadDelegate::*)(QSslPreSharedKeyAuthenticator * )>(_a, &QHttpThreadDelegate::preSharedKeyAuthenticationRequired, 5))
            return;
        if (QtMocHelpers::indexOfMethod<void (QHttpThreadDelegate::*)()>(_a, &QHttpThreadDelegate::socketStartedConnecting, 6))
            return;
        if (QtMocHelpers::indexOfMethod<void (QHttpThreadDelegate::*)()>(_a, &QHttpThreadDelegate::requestSent, 7))
            return;
        if (QtMocHelpers::indexOfMethod<void (QHttpThreadDelegate::*)(const QHttpHeaders & , int , const QString & , bool , QSharedPointer<char> , qint64 , qint64 , bool , bool )>(_a, &QHttpThreadDelegate::downloadMetaData, 8))
            return;
        if (QtMocHelpers::indexOfMethod<void (QHttpThreadDelegate::*)(qint64 , qint64 )>(_a, &QHttpThreadDelegate::downloadProgress, 9))
            return;
        if (QtMocHelpers::indexOfMethod<void (QHttpThreadDelegate::*)(const QByteArray & )>(_a, &QHttpThreadDelegate::downloadData, 10))
            return;
        if (QtMocHelpers::indexOfMethod<void (QHttpThreadDelegate::*)(QNetworkReply::NetworkError , const QString & )>(_a, &QHttpThreadDelegate::error, 11))
            return;
        if (QtMocHelpers::indexOfMethod<void (QHttpThreadDelegate::*)()>(_a, &QHttpThreadDelegate::downloadFinished, 12))
            return;
        if (QtMocHelpers::indexOfMethod<void (QHttpThreadDelegate::*)(const QUrl & , int , int )>(_a, &QHttpThreadDelegate::redirected, 13))
            return;
    }
}